

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurlHandle.cpp
# Opt level: O1

int __thiscall
curlpp::internal::CurlHandle::clone
          (CurlHandle *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CURL *handle;
  CurlHandle *this_00;
  
  handle = (CURL *)curl_easy_duphandle(*(undefined8 *)(__fn + 8));
  runtimeAssert("Error when trying to curl_easy_duphandle() a handle",handle != (CURL *)0x0);
  this_00 = (CurlHandle *)operator_new(0x150);
  CurlHandle(this_00,handle);
  this->_vptr_CurlHandle = (_func_int **)this_00;
  return (int)this;
}

Assistant:

std::auto_ptr<CurlHandle> 
CurlHandle::clone() const
{
	CURL * cHandle = curl_easy_duphandle(mCurl);
	runtimeAssert("Error when trying to curl_easy_duphandle() a handle", cHandle != NULL);
	auto_ptr<CurlHandle> newHandle(new CurlHandle(cHandle));

	return newHandle;
}